

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_accept_pointsize_data)

{
  stringstream result_code;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n\n${SHADER_IO_BLOCKS_REQUIRE}\n\nprecision highp float;\nprecision highp int;\nout layout (location = 0) vec4 col;\n"
                 );
  if (should_accept_pointsize_data) {
    std::operator<<(&local_190,"in      float te_pointsize;\n");
  }
  std::operator<<(&local_190,
                  "in       vec4 te_position;\nin       vec2 te_value1;\nin flat ivec4 te_value2;\n\nvoid main()\n{\n  col = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getFragmentShaderCode(
	bool should_accept_pointsize_data)
{
	// Requires input to match previous stage's output
	std::stringstream result_code;

	result_code << "${VERSION}\n"
				   "\n"
				   "${SHADER_IO_BLOCKS_REQUIRE}\n"
				   "\n"
				   "precision highp float;\n"
				   "precision highp int;\n"
				   "out layout (location = 0) vec4 col;\n";

	if (should_accept_pointsize_data)
	{
		result_code << "in      float te_pointsize;\n";
	}

	result_code << "in       vec4 te_position;\n"
				   "in       vec2 te_value1;\n"
				   "in flat ivec4 te_value2;\n"
				   "\n"
				   "void main()\n"
				   "{\n"
				   "  col = vec4(1.0, 1.0, 1.0, 1.0);\n"
				   "}\n";

	return result_code.str();
}